

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall
CPP::WriteInitialization::writeThemeIconCheckAssignment
          (WriteInitialization *this,QString *themeValue,QString *iconName,DomResourceIcon *i)

{
  QString *pQVar1;
  QString *indent;
  Uic *pUVar2;
  long lVar3;
  Language LVar4;
  QTextStream *pQVar5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LVar4 = language::language();
  pQVar1 = &this->m_indent;
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
  QTextStream::operator<<(pQVar5,"if ");
  if (LVar4 == Cpp) {
    QTextStream::operator<<(this->m_output,'(');
    pcVar6 = ") {";
    pcVar7 = "} else {";
  }
  else {
    pcVar6 = ":";
    pcVar7 = "else:";
  }
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,"QIcon");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)language::qualifier);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"hasThemeIcon(");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,themeValue);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,')');
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,pcVar6);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,'\n');
  indent = &this->m_dindent;
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,indent);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iconName);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," = ");
  local_50.d = (themeValue->d).d;
  local_50.ptr = (themeValue->d).ptr;
  local_50.size = (themeValue->d).size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  CPP::operator<<(pQVar5,(iconFromTheme *)&local_50);
  QTextStream::operator<<(pQVar5,(QString *)language::eol);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,pcVar7);
  QTextStream::operator<<(pQVar5,'\n');
  pUVar2 = this->m_uic;
  local_50.d = (pUVar2->pixFunction).d.d;
  local_50.ptr = (pUVar2->pixFunction).d.ptr;
  lVar3 = (pUVar2->pixFunction).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.size = lVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar3 == 0) {
    writeResourceIcon(this->m_output,iconName,indent,i);
  }
  else {
    writePixmapFunctionIcon(this,this->m_output,iconName,indent,i);
  }
  if (LVar4 == Cpp) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
    QTextStream::operator<<(pQVar5,'}');
  }
  QTextStream::operator<<(this->m_output,'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::writeThemeIconCheckAssignment(const QString &themeValue,
                                                        const QString &iconName,
                                                        const DomResourceIcon *i)

{
    const bool isCpp = language::language() == Language::Cpp;
    m_output << m_indent << "if ";
    if (isCpp)
        m_output << '(';
    m_output << "QIcon" << language::qualifier << "hasThemeIcon("
             << themeValue << ')' << (isCpp ? ") {" : ":") << '\n'
             << m_dindent << iconName << " = " << iconFromTheme(themeValue)
             << language::eol;
    m_output << m_indent << (isCpp ? "} else {" : "else:") << '\n';
    if (m_uic->pixmapFunction().isEmpty())
        writeResourceIcon(m_output, iconName, m_dindent, i);
    else
        writePixmapFunctionIcon(m_output, iconName, m_dindent, i);
    if (isCpp)
        m_output << m_indent << '}';
    m_output  << '\n';
}